

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VehicleState.cc
# Opt level: O0

Vector2d __thiscall
VehicleState::Propagator::GetRangeAndRate(Propagator *this,Vector3d *pos_station_ecef,double tof)

{
  double dVar1;
  pointer pMVar2;
  double dVar3;
  Scalar *pSVar4;
  MatrixBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> *other;
  reference scalar;
  Scalar *pSVar5;
  vector<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_std::allocator<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>_>
  *this_00;
  long in_RSI;
  double dVar6;
  MatrixBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> *this_01;
  RealScalar RVar7;
  ReturnType RVar8;
  DenseCoeffsBase<Eigen::Matrix<double,_2,_1,_0,_2,_1>,_1> *this_02;
  double extraout_XMM0_Qa;
  undefined4 uVar9;
  undefined4 uVar10;
  Vector2d VVar11;
  Vector3d rel_vel;
  Vector3d rel_pos;
  Vector3d accel_station_eci;
  Vector3d vel_station_eci;
  vector<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_std::allocator<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>_>
  *in_stack_00000450;
  MatrixXd *in_stack_00000458;
  MatrixXd *in_stack_00000460;
  double in_stack_00000468;
  Vector3d accel_station_pef;
  Vector3d vel_station_pef;
  Vector3d earthrot_vec;
  double LOD;
  Vector3d pos_station_pef;
  Vector3d pos_station;
  Matrix3d R_ecef2eci;
  vector<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_std::allocator<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>_>
  matvec;
  Vector3d vel_craft;
  Vector3d pos_craft;
  double earthrot;
  double JD_UTC;
  Vector2d *z;
  MatrixBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> *in_stack_fffffffffffff998;
  DenseCoeffsBase<Eigen::Matrix<double,_2,_1,_0,_2,_1>,_1> *in_stack_fffffffffffff9a0;
  MatrixBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_> *in_stack_fffffffffffff9a8;
  MatrixBase<Eigen::Product<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_Eigen::Matrix<double,_3,_3,_0,_3,_3>,_0>_>
  *in_stack_fffffffffffff9b0;
  Scalar *in_stack_fffffffffffff9b8;
  MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
  *in_stack_fffffffffffff9c0;
  MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
  *in_stack_fffffffffffff9c8;
  Matrix<double,_3,_1,_0,_3,_1> *in_stack_fffffffffffff9d0;
  StorageBaseType *in_stack_fffffffffffff9e0;
  StorageBaseType *matrix;
  double *in_stack_fffffffffffff9e8;
  Matrix3d *in_stack_fffffffffffffcd8;
  vector<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_std::allocator<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>_>
  local_78 [3];
  double local_30;
  double local_28;
  
  local_28 = *(double *)(in_RSI + 0x110) + *(double *)(in_RSI + 0x108) / 86400.0;
  local_30 = *(double *)(in_RSI + 200);
  Eigen::Matrix<double,_3,_1,_0,_3,_1>::Matrix
            ((Matrix<double,_3,_1,_0,_3,_1> *)in_stack_fffffffffffff9a0,
             (Matrix<double,_3,_1,_0,_3,_1> *)in_stack_fffffffffffff998);
  Eigen::Matrix<double,_3,_1,_0,_3,_1>::Matrix
            ((Matrix<double,_3,_1,_0,_3,_1> *)in_stack_fffffffffffff9a0,
             (Matrix<double,_3,_1,_0,_3,_1> *)in_stack_fffffffffffff998);
  Eigen::MatrixBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>::Identity
            ((Index)in_stack_fffffffffffff9c8,(Index)in_stack_fffffffffffff9c0);
  Eigen::Matrix<double,3,3,0,3,3>::
  Matrix<Eigen::CwiseNullaryOp<Eigen::internal::scalar_identity_op<double>,Eigen::Matrix<double,3,3,0,3,3>>>
            ((Matrix<double,_3,_3,_0,_3,_3> *)in_stack_fffffffffffff9a0,
             (EigenBase<Eigen::CwiseNullaryOp<Eigen::internal::scalar_identity_op<double>,_Eigen::Matrix<double,_3,_3,_0,_3,_3>_>_>
              *)in_stack_fffffffffffff998);
  std::allocator<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>::allocator
            ((allocator<Eigen::Matrix<double,_3,_3,_0,_3,_3>_> *)0x150c86);
  std::
  vector<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_std::allocator<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>_>
  ::vector((vector<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_std::allocator<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>_>
            *)in_stack_fffffffffffff9c0,(size_type)in_stack_fffffffffffff9b8,
           (value_type *)in_stack_fffffffffffff9b0,(allocator_type *)in_stack_fffffffffffff9a8);
  std::allocator<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>::~allocator
            ((allocator<Eigen::Matrix<double,_3,_3,_0,_3,_3>_> *)0x150cb7);
  Util::ECEF2ECI(in_stack_00000468,in_stack_00000460,in_stack_00000458,in_stack_00000450);
  Eigen::MatrixBase<Eigen::Matrix<double,3,3,0,3,3>>::operator*
            ((MatrixBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_> *)in_stack_fffffffffffff9a0,
             in_stack_fffffffffffff998);
  Eigen::Matrix<double,3,1,0,3,1>::
  Matrix<Eigen::Product<Eigen::Matrix<double,3,3,0,3,3>,Eigen::Matrix<double,3,1,0,3,1>,0>>
            ((Matrix<double,_3,_1,_0,_3,_1> *)in_stack_fffffffffffff9a0,
             (EigenBase<Eigen::Product<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0>_>
              *)in_stack_fffffffffffff998);
  Eigen::Matrix<double,_2,_1,_0,_2,_1>::Matrix((Matrix<double,_2,_1,_0,_2,_1> *)0x150d59);
  std::
  vector<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_std::allocator<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>_>
  ::operator[](local_78,3);
  Eigen::MatrixBase<Eigen::Matrix<double,3,3,0,3,3>>::operator*
            ((MatrixBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_> *)in_stack_fffffffffffff9a0,
             in_stack_fffffffffffff998);
  Eigen::Matrix<double,3,1,0,3,1>::
  Matrix<Eigen::Product<Eigen::Matrix<double,3,3,0,3,3>,Eigen::Matrix<double,3,1,0,3,1>,0>>
            ((Matrix<double,_3,_1,_0,_3,_1> *)in_stack_fffffffffffff9a0,
             (EigenBase<Eigen::Product<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0>_>
              *)in_stack_fffffffffffff998);
  std::
  vector<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_std::allocator<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>_>
  ::operator[](local_78,4);
  Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1>::operator()
            ((DenseCoeffsBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1> *)in_stack_fffffffffffff9a0,
             (Index)in_stack_fffffffffffff998,0x150de7);
  Eigen::Matrix<double,_3,_1,_0,_3,_1>::Matrix
            (in_stack_fffffffffffff9d0,(Scalar *)in_stack_fffffffffffff9c8,
             (Scalar *)in_stack_fffffffffffff9c0,in_stack_fffffffffffff9b8);
  Eigen::Matrix<double,_3,_1,_0,_3,_1>::Matrix((Matrix<double,_3,_1,_0,_3,_1> *)0x150e52);
  dVar6 = -local_30;
  pSVar4 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_1>::operator[]
                     ((DenseCoeffsBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_1> *)
                      in_stack_fffffffffffff9a0,(Index)in_stack_fffffffffffff998);
  dVar1 = *pSVar4;
  pSVar4 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_1>::operator[]
                     ((DenseCoeffsBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_1> *)
                      in_stack_fffffffffffff9a0,(Index)in_stack_fffffffffffff998);
  dVar3 = local_30;
  *pSVar4 = dVar6 * dVar1;
  pSVar4 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_1>::operator[]
                     ((DenseCoeffsBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_1> *)
                      in_stack_fffffffffffff9a0,(Index)in_stack_fffffffffffff998);
  this_01 = (MatrixBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> *)(dVar3 * *pSVar4);
  pSVar4 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_1>::operator[]
                     ((DenseCoeffsBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_1> *)
                      in_stack_fffffffffffff9a0,(Index)in_stack_fffffffffffff998);
  *pSVar4 = (Scalar)this_01;
  other = (MatrixBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> *)
          Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_1>::operator[]
                    ((DenseCoeffsBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_1> *)
                     in_stack_fffffffffffff9a0,(Index)in_stack_fffffffffffff998);
  *(undefined8 *)other = 0;
  Eigen::MatrixBase<Eigen::Matrix<double,3,1,0,3,1>>::cross<Eigen::Matrix<double,3,1,0,3,1>>
            (this_01,other);
  Eigen::operator*(in_stack_fffffffffffff9e8,in_stack_fffffffffffff9e0);
  Eigen::Matrix<double,3,1,0,3,1>::
  Matrix<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,3,1,0,3,1>const>const,Eigen::Matrix<double,3,1,0,3,1>const>>
            ((Matrix<double,_3,_1,_0,_3,_1> *)in_stack_fffffffffffff9a0,
             (EigenBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
              *)in_stack_fffffffffffff998);
  std::
  vector<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_std::allocator<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>_>
  ::operator[](local_78,0);
  std::
  vector<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_std::allocator<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>_>
  ::operator[](local_78,1);
  Eigen::MatrixBase<Eigen::Matrix<double,3,3,0,3,3>>::operator*
            ((MatrixBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_> *)in_stack_fffffffffffff9a0,
             (MatrixBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_> *)in_stack_fffffffffffff998);
  std::
  vector<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_std::allocator<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>_>
  ::operator[](local_78,2);
  Eigen::
  MatrixBase<Eigen::Product<Eigen::Matrix<double,3,3,0,3,3>,Eigen::Matrix<double,3,3,0,3,3>,0>>::
  operator*(in_stack_fffffffffffff9b0,in_stack_fffffffffffff9a8);
  Eigen::Matrix<double,3,3,0,3,3>::
  Matrix<Eigen::Product<Eigen::Product<Eigen::Matrix<double,3,3,0,3,3>,Eigen::Matrix<double,3,3,0,3,3>,0>,Eigen::Matrix<double,3,3,0,3,3>,0>>
            ((Matrix<double,_3,_3,_0,_3,_3> *)in_stack_fffffffffffff9a0,
             (EigenBase<Eigen::Product<Eigen::Product<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_Eigen::Matrix<double,_3,_3,_0,_3,_3>,_0>,_Eigen::Matrix<double,_3,_3,_0,_3,_3>,_0>_>
              *)in_stack_fffffffffffff998);
  Util::OrthoNormMat(in_stack_fffffffffffffcd8);
  Eigen::MatrixBase<Eigen::Matrix<double,3,3,0,3,3>>::operator*
            ((MatrixBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_> *)in_stack_fffffffffffff9a0,
             in_stack_fffffffffffff998);
  Eigen::Matrix<double,3,1,0,3,1>::
  Matrix<Eigen::Product<Eigen::Matrix<double,3,3,0,3,3>,Eigen::Matrix<double,3,1,0,3,1>,0>>
            ((Matrix<double,_3,_1,_0,_3,_1> *)in_stack_fffffffffffff9a0,
             (EigenBase<Eigen::Product<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0>_>
              *)in_stack_fffffffffffff998);
  matrix = (StorageBaseType *)local_78;
  scalar = std::
           vector<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_std::allocator<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>_>
           ::operator[]((vector<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_std::allocator<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>_>
                         *)matrix,0);
  std::
  vector<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_std::allocator<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>_>
  ::operator[]((vector<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_std::allocator<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>_>
                *)matrix,1);
  Eigen::MatrixBase<Eigen::Matrix<double,3,3,0,3,3>>::operator*
            ((MatrixBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_> *)in_stack_fffffffffffff9a0,
             (MatrixBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_> *)in_stack_fffffffffffff998);
  std::
  vector<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_std::allocator<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>_>
  ::operator[](local_78,2);
  Eigen::
  MatrixBase<Eigen::Product<Eigen::Matrix<double,3,3,0,3,3>,Eigen::Matrix<double,3,3,0,3,3>,0>>::
  operator*(in_stack_fffffffffffff9b0,in_stack_fffffffffffff9a8);
  Eigen::Matrix<double,3,3,0,3,3>::
  Matrix<Eigen::Product<Eigen::Product<Eigen::Matrix<double,3,3,0,3,3>,Eigen::Matrix<double,3,3,0,3,3>,0>,Eigen::Matrix<double,3,3,0,3,3>,0>>
            ((Matrix<double,_3,_3,_0,_3,_3> *)in_stack_fffffffffffff9a0,
             (EigenBase<Eigen::Product<Eigen::Product<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_Eigen::Matrix<double,_3,_3,_0,_3,_3>,_0>,_Eigen::Matrix<double,_3,_3,_0,_3,_3>,_0>_>
              *)in_stack_fffffffffffff998);
  Util::OrthoNormMat(in_stack_fffffffffffffcd8);
  Eigen::MatrixBase<Eigen::Matrix<double,3,3,0,3,3>>::operator*
            ((MatrixBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_> *)in_stack_fffffffffffff9a0,
             in_stack_fffffffffffff998);
  Eigen::Matrix<double,3,1,0,3,1>::
  Matrix<Eigen::Product<Eigen::Matrix<double,3,3,0,3,3>,Eigen::Matrix<double,3,1,0,3,1>,0>>
            ((Matrix<double,_3,_1,_0,_3,_1> *)in_stack_fffffffffffff9a0,
             (EigenBase<Eigen::Product<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0>_>
              *)in_stack_fffffffffffff998);
  Eigen::MatrixBase<Eigen::Matrix<double,3,1,0,3,1>>::operator-
            ((MatrixBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> *)in_stack_fffffffffffff9c8,
             (MatrixBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> *)in_stack_fffffffffffff9c0);
  Eigen::operator*((double *)scalar,matrix);
  Eigen::
  MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,double>,Eigen::Matrix<double,3,1,0,3,1>const,Eigen::Matrix<double,3,1,0,3,1>const>>
  ::operator+(in_stack_fffffffffffff9c8,in_stack_fffffffffffff9c0);
  Eigen::Matrix<double,3,1,0,3,1>::
  Matrix<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,double>,Eigen::Matrix<double,3,1,0,3,1>const,Eigen::Matrix<double,3,1,0,3,1>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,3,1,0,3,1>const>const,Eigen::Matrix<double,3,1,0,3,1>const>const>>
            ((Matrix<double,_3,_1,_0,_3,_1> *)in_stack_fffffffffffff9a0,
             (EigenBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>_>
              *)in_stack_fffffffffffff998);
  Eigen::MatrixBase<Eigen::Matrix<double,3,1,0,3,1>>::operator-
            ((MatrixBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> *)in_stack_fffffffffffff9c8,
             (MatrixBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> *)in_stack_fffffffffffff9c0);
  Eigen::operator*((double *)scalar,matrix);
  Eigen::
  MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,double>,Eigen::Matrix<double,3,1,0,3,1>const,Eigen::Matrix<double,3,1,0,3,1>const>>
  ::operator+(in_stack_fffffffffffff9c8,in_stack_fffffffffffff9c0);
  Eigen::Matrix<double,3,1,0,3,1>::
  Matrix<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,double>,Eigen::Matrix<double,3,1,0,3,1>const,Eigen::Matrix<double,3,1,0,3,1>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,3,1,0,3,1>const>const,Eigen::Matrix<double,3,1,0,3,1>const>const>>
            ((Matrix<double,_3,_1,_0,_3,_1> *)in_stack_fffffffffffff9a0,
             (EigenBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>_>
              *)in_stack_fffffffffffff998);
  RVar7 = Eigen::MatrixBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>::norm(in_stack_fffffffffffff998);
  pSVar5 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_2,_1,_0,_2,_1>,_1>::operator[]
                     (in_stack_fffffffffffff9a0,(Index)in_stack_fffffffffffff998);
  *pSVar5 = RVar7;
  RVar8 = Eigen::MatrixBase<Eigen::Matrix<double,3,1,0,3,1>>::dot<Eigen::Matrix<double,3,1,0,3,1>>
                    ((MatrixBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> *)in_stack_fffffffffffff9a0,
                     in_stack_fffffffffffff998);
  this_00 = (vector<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_std::allocator<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>_>
             *)Eigen::DenseCoeffsBase<Eigen::Matrix<double,_2,_1,_0,_2,_1>,_1>::operator[]
                         (in_stack_fffffffffffff9a0,(Index)in_stack_fffffffffffff998);
  pMVar2 = (this_00->
           super__Vector_base<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_std::allocator<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>_>
           )._M_impl.super__Vector_impl_data._M_start;
  uVar9 = SUB84(pMVar2,0);
  uVar10 = (undefined4)((ulong)pMVar2 >> 0x20);
  this_02 = (DenseCoeffsBase<Eigen::Matrix<double,_2,_1,_0,_2,_1>,_1> *)(RVar8 / (double)pMVar2);
  pSVar5 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_2,_1,_0,_2,_1>,_1>::operator[]
                     (this_02,(Index)in_stack_fffffffffffff998);
  *pSVar5 = (Scalar)this_02;
  std::
  vector<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_std::allocator<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>_>
  ::~vector(this_00);
  VVar11.super_PlainObjectBase<Eigen::Matrix<double,_2,_1,_0,_2,_1>_>.m_storage.m_data.array[1].
  _4_4_ = uVar10;
  VVar11.super_PlainObjectBase<Eigen::Matrix<double,_2,_1,_0,_2,_1>_>.m_storage.m_data.array[1].
  _0_4_ = uVar9;
  VVar11.super_PlainObjectBase<Eigen::Matrix<double,_2,_1,_0,_2,_1>_>.m_storage.m_data.array[0] =
       extraout_XMM0_Qa;
  return (Vector2d)
         VVar11.super_PlainObjectBase<Eigen::Matrix<double,_2,_1,_0,_2,_1>_>.m_storage.m_data.array;
}

Assistant:

Eigen::Vector2d Propagator::GetRangeAndRate(Eigen::Vector3d pos_station_ecef, double tof){

		//locals
		double JD_UTC = this->t_JD_ + this->t_/(24.0*60.0*60.0); //current UTC Julian Date in days
		double earthrot = this->earthrotationspeed_;
		Eigen::Vector3d pos_craft = this->pos_;
		Eigen::Vector3d vel_craft = this->vel_;
		std::vector<Eigen::Matrix3d> matvec(4, Eigen::Matrix3d::Identity(3,3));
		Eigen::Matrix3d R_ecef2eci = Util::ECEF2ECI(JD_UTC, this->gravmodel_->nut80ptr_, this->gravmodel_->iau1980ptr_, &matvec); //matrix rotating from ECEF2ECI


		//convert station position to ECI
		Eigen::Vector3d pos_station = R_ecef2eci*pos_station_ecef;

		//initialize measurement
		Eigen::Vector2d z;

		//station ECI velocity
		// Eigen::Vector3d vel_station;
		// vel_station[0] = -1.0*earthrot*pos_station[1];
		// vel_station[1] = earthrot*pos_station[0];
		// vel_station[2] = 0.0;

		// std::cout << "vel1: \n" << vel_station << "\n";

		// Vallado IAU-76/FK5 transformation for velocity
		//convert station position to PEF 
		Eigen::Vector3d pos_station_pef = matvec[3]*pos_station_ecef;

		//modify earth rate
		double LOD = matvec[4](0,0);
		// earthrot = earthrot*(1.0 - LOD/86400.0);
		Eigen::Vector3d earthrot_vec{0.0, 0.0, earthrot};

		//station PEF velocity
		Eigen::Vector3d vel_station_pef;
		vel_station_pef[0] = -1.0*earthrot*pos_station_pef[1];
		vel_station_pef[1] = earthrot*pos_station_pef[0];
		vel_station_pef[2] = 0.0;

		// //station PEF acceleration
		// Eigen::Vector3d accel_station_pef;
		// accel_station_pef[0] = -1.0*earthrot*earthrot*pos_station_pef[0];
		// accel_station_pef[1] = -1.0*earthrot*earthrot*pos_station_pef[1];
		// accel_station_pef[2] = 0.0;

		// std::cout << accel_station_pef << "\n";

		//station PEF acceleration with a different method specified by vallado
		Eigen::Vector3d accel_station_pef = 1.0*earthrot_vec.cross(vel_station_pef);

		// std::cout << accel_station_pef2 << "\n";

		// exit(0);

		//station ECI velocity
		Eigen::Vector3d vel_station_eci = Util::OrthoNormMat(matvec[0]*matvec[1]*matvec[2])*vel_station_pef;

		//stations ECI accel
		Eigen::Vector3d accel_station_eci = Util::OrthoNormMat(matvec[0]*matvec[1]*matvec[2])*accel_station_pef;

		// std::cout << "vel2: \n" << R_ecef2eci*vel_station_ecef << "\n";

		// exit(0);

		//relative position and velocity
		Eigen::Vector3d rel_pos = pos_craft - pos_station + tof*vel_station_eci;
		Eigen::Vector3d rel_vel  = vel_craft - vel_station_eci + tof*accel_station_eci;

		// std::cout << "Aberation position correction: " << (tof*vel_station_eci).norm() << "\n";
		// exit(0);

		//range
		z[0] = rel_pos.norm();

		//range rate
		z[1] = rel_pos.dot(rel_vel)/z[0];

		return z;

	}